

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  Type *value;
  int local_14;
  int i;
  RepeatedPtrFieldBase *this_local;
  
  for (local_14 = 0; local_14 < this->allocated_size_; local_14 = local_14 + 1) {
    value = cast<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                      (this->elements_[local_14]);
    GenericTypeHandler<google::protobuf::EnumDescriptorProto>::Delete(value);
  }
  if (this->elements_ != (void **)0x0) {
    operator_delete__(this->elements_);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  for (int i = 0; i < allocated_size_; i++) {
    TypeHandler::Delete(cast<TypeHandler>(elements_[i]));
  }
  delete [] elements_;
}